

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv2d.cpp
# Opt level: O2

void benchmark<remora::matrix<float,remora::row_major,remora::cpu_tag>,remora::vector<float,remora::cpu_tag>>
               (matrix_expression<remora::matrix<float,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                *image,vector_expression<remora::vector<float,_remora::cpu_tag>,_remora::cpu_tag>
                       *filter,size_t num_channels,size_t num_filters,size_t image_size1,
               size_t image_size2,size_t filter_size)

{
  ulong uVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  size_t i;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double local_98;
  matrix<float,_remora::row_major,_remora::cpu_tag> out;
  Timer time;
  
  lVar4 = (image_size1 - filter_size) + 1;
  lVar2 = (image_size2 - filter_size) + 1;
  time.m_lastLap._0_4_ = 0;
  remora::matrix<float,_remora::row_major,_remora::cpu_tag>::matrix
            (&out,*(size_type *)image,lVar4 * num_filters * lVar2,(value_type *)&time);
  local_98 = 1.79769313486232e+308;
  lVar5 = 0;
  while( true ) {
    uVar1 = *(ulong *)image;
    if (lVar5 == 0x14 / uVar1 + (ulong)(0x14 / uVar1 == 0)) break;
    Timer::Timer(&time,true);
    remora::bindings::
    conv2d<remora::matrix<float,remora::row_major,remora::cpu_tag>,remora::vector<float,remora::cpu_tag>,remora::matrix<float,remora::row_major,remora::cpu_tag>>
              (image,filter,
               (matrix_expression<remora::matrix<float,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
                *)&out,num_channels,num_filters,image_size1,image_size2,filter_size,filter_size,0,0)
    ;
    dVar6 = Timer::stop(&time);
    if (local_98 <= dVar6) {
      dVar6 = local_98;
    }
    lVar5 = lVar5 + 1;
    local_98 = dVar6;
  }
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"\t");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,"\t");
  std::operator<<((ostream *)&std::cout,"\t");
  lVar4 = filter_size * filter_size * lVar2 * num_filters * num_channels * lVar4;
  auVar7._8_4_ = (int)((ulong)lVar4 >> 0x20);
  auVar7._0_8_ = lVar4;
  auVar7._12_4_ = 0x45300000;
  auVar8._8_4_ = (int)(uVar1 >> 0x20);
  auVar8._0_8_ = uVar1;
  auVar8._12_4_ = 0x45300000;
  poVar3 = std::ostream::_M_insert<double>
                     ((((auVar8._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) *
                       ((auVar7._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) *
                       0.0009765625 * 0.0009765625) / local_98);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&out.m_data.super__Vector_base<float,_std::allocator<float>_>);
  return;
}

Assistant:

void benchmark(
	matrix_expression<E1, cpu_tag> const& image,
	vector_expression<E2, cpu_tag> const& filter,
	std::size_t num_channels,
	std::size_t num_filters,
	std::size_t image_size1,
	std::size_t image_size2,
	std::size_t filter_size
){
	std::size_t output_size1 = image_size1 - filter_size +1;
	std::size_t output_size2 = image_size2 - filter_size +1;
	typedef typename E1::value_type value_type;

	remora::matrix<value_type> out(image().size1(), output_size1 * num_filters * output_size2, 0.0);
	double minOptTime = std::numeric_limits<double>::max();
	for(std::size_t i = 0; i != std::max<std::size_t>(1, std::size_t(20/image().size1())); ++i){
		Timer time;
		kernels::conv2d(image,filter,out, num_channels, num_filters, image_size1, image_size2, filter_size, filter_size,0,0);
		minOptTime = std::min(minOptTime,time.stop());
	}

	double mults = output_size1 * output_size2 * filter_size * filter_size * num_filters * num_channels;
	double flops = image().size1() * mults /1024/1024/minOptTime;

	std::cout<<output_size1<<"\t"<<filter_size<<"\t"<<num_channels<<"\t"<< num_filters<<"\t";
	std::cout<<"\t"<<flops<< std::endl;
}